

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
__thiscall duckdb::PhysicalLimit::GetGlobalSourceState(PhysicalLimit *this,ClientContext *context)

{
  _func_int **in_RAX;
  
  make_uniq<duckdb::LimitSourceState>();
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = in_RAX;
  return (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         this;
}

Assistant:

unique_ptr<GlobalSourceState> PhysicalLimit::GetGlobalSourceState(ClientContext &context) const {
	return make_uniq<LimitSourceState>();
}